

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O2

void convertArrayToMap(QCborContainerPrivate **array)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  QCborContainerPrivate *pQVar3;
  Element *pEVar4;
  undefined8 uVar5;
  QCborContainerPrivate *x;
  iterator iVar6;
  ValueFlags *pVVar7;
  QCborContainerPrivate *pQVar8;
  long lVar9;
  long in_FS_OFFSET;
  QMessageLogger local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*array != (QCborContainerPrivate *)0x0) && (((*array)->elements).d.size != 0)) {
    local_50.context.version = 2;
    local_50.context.function._4_4_ = 0;
    local_50.context._4_8_ = 0;
    local_50.context._12_8_ = 0;
    local_50.context.category = "default";
    QMessageLogger::warning(&local_50,"Using CBOR array as map forced conversion");
    pQVar3 = (QCborContainerPrivate *)((*array)->elements).d.size;
    x = QCborContainerPrivate::detach(*array,(long)pQVar3 * 2);
    QList<QtCbor::Element>::resize(&x->elements,(long)pQVar3 * 2);
    iVar6 = QList<QtCbor::Element>::begin(&x->elements);
    pEVar4 = ((*array)->elements).d.ptr;
    lVar9 = (long)pQVar3 << 4;
    for (pQVar8 = pQVar3; 0 < (long)pQVar8;
        pQVar8 = (QCborContainerPrivate *)((long)&pQVar8[-1].elements.d.size + 7)) {
      puVar1 = (undefined8 *)((long)&pEVar4[-1].field_0 + lVar9);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)&iVar6.i[-1].field_0 + lVar9 * 2);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      lVar9 = lVar9 + -0x10;
    }
    pVVar7 = &(iVar6.i)->flags;
    for (pQVar8 = (QCborContainerPrivate *)0x0; pQVar3 != pQVar8;
        pQVar8 = (QCborContainerPrivate *)
                 ((long)&(pQVar8->super_QSharedData).ref.super_QAtomicInteger<int>.
                         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + 1)) {
      (((Element *)(pVVar7 + -3))->field_0).container = pQVar8;
      *(undefined8 *)(pVVar7 + -1) = 0;
      pVVar7 = pVVar7 + 8;
    }
    assignContainer(array,x);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void convertArrayToMap(QCborContainerPrivate *&array)
{
    if (Q_LIKELY(!array || array->elements.isEmpty()))
        return;

    // The Q_LIKELY and the qWarning mark the rest of this function as unlikely
    qWarning("Using CBOR array as map forced conversion");

    qsizetype size = array->elements.size();
    QCborContainerPrivate *map = QCborContainerPrivate::detach(array, size * 2);
    map->elements.resize(size * 2);

    // this may be an in-place copy, so we have to do it from the end
    auto dst = map->elements.begin();
    auto src = array->elements.constBegin();
    for (qsizetype i = size - 1; i >= 0; --i) {
        Q_ASSERT(src->type != QCborValue::Invalid);
        dst[i * 2 + 1] = src[i];
    }
    for (qsizetype i = 0; i < size; ++i)
        dst[i * 2] = { i, QCborValue::Integer };

    // update reference counts
    assignContainer(array, map);
}